

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O0

bool __thiscall llvm::SmallPtrSetImplBase::erase_imp(SmallPtrSetImplBase *this,void *Ptr)

{
  void **ppvVar1;
  void **ppvVar2;
  void *pvVar3;
  void **Loc;
  void **P;
  void *Ptr_local;
  SmallPtrSetImplBase *this_local;
  
  ppvVar1 = find_imp(this,Ptr);
  ppvVar2 = EndPointer(this);
  if (ppvVar1 == ppvVar2) {
    this_local._7_1_ = false;
  }
  else {
    if (*ppvVar1 != Ptr) {
      __assert_fail("*Loc == Ptr && \"broken find!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                    ,0xa8,"bool llvm::SmallPtrSetImplBase::erase_imp(const void *)");
    }
    pvVar3 = getTombstoneMarker();
    *ppvVar1 = pvVar3;
    this->NumTombstones = this->NumTombstones + 1;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool erase_imp(const void * Ptr) {
    const void *const *P = find_imp(Ptr);
    if (P == EndPointer())
      return false;

    const void **Loc = const_cast<const void **>(P);
    assert(*Loc == Ptr && "broken find!");
    *Loc = getTombstoneMarker();
    NumTombstones++;
    return true;
  }